

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O2

void __thiscall Clasp::Cli::ClaspCliConfig::ClaspCliConfig(ClaspCliConfig *this)

{
  long lVar1;
  
  ClaspConfig::ClaspConfig(&this->super_ClaspConfig);
  (this->super_ClaspConfig).super_BasicSatConfig.super_UserConfiguration.super_Configuration.
  _vptr_Configuration = (_func_int **)&PTR__ClaspCliConfig_001e7600;
  (this->opts_).ptr_ = 0;
  this->parseCtx_ = (ParseContext *)0x0;
  lVar1 = 0;
  do {
    *(char **)((long)&this->config_[0]._M_dataplus._M_p + lVar1) =
         this->config_[0].field_2._M_local_buf + lVar1;
    *(undefined8 *)((long)&this->config_[0]._M_string_length + lVar1) = 0;
    this->config_[0].field_2._M_local_buf[lVar1] = '\0';
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x40);
  this->validate_ = false;
  return;
}

Assistant:

ClaspCliConfig::ClaspCliConfig() : parseCtx_(0), validate_(false) {
	static_assert(
		(option_category_context_begin< option_category_solver_begin) &&
		(option_category_solver_begin < option_category_search_begin) &&
		(option_category_search_begin < option_category_asp_begin)    &&
		(option_category_asp_begin    < option_category_solve_begin)  &&
		(option_category_solve_begin  < option_category_solve_end), "unexpected option order");
}